

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O1

int __thiscall cmsys::CommandLineArguments::Parse(CommandLineArguments *this)

{
  size_type *psVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  Internal *pIVar5;
  long lVar6;
  mapped_type *cs;
  ostream *poVar7;
  undefined8 uVar8;
  char cVar9;
  size_type *psVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  pointer pbVar14;
  string *psVar15;
  pointer pSVar16;
  size_type sVar17;
  size_type sVar18;
  long lVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  int local_74;
  long *local_68 [2];
  long local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->StoreUnusedArgumentsFlag == true) {
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::_M_erase_at_end
              (&(this->Internals->UnusedArguments).
                super_vector<cmsys::String,_std::allocator<cmsys::String>_>,
               (this->Internals->UnusedArguments).
               super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
               super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  pIVar5 = this->Internals;
  pSVar16 = (pIVar5->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
            super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar4 = 1;
  if ((pIVar5->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
      super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar16) {
    sVar18 = 0;
    do {
      lVar19 = sVar18 * 0x20;
      psVar15 = &pSVar16[sVar18].super_string;
      pIVar5->LastArgument = sVar18;
      bVar3 = GetMatchedArguments(this,&local_48,psVar15);
      if (!bVar3) {
        pIVar5 = this->Internals;
        if (pIVar5->UnknownArgumentCallback == (ErrorCallbackType)0x0) {
          if (this->StoreUnusedArgumentsFlag != true) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Got unknown argument: \"",0x17);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(psVar15->_M_dataplus)._M_p,
                                psVar15->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
            std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            goto LAB_00447eaa;
          }
          std::__cxx11::string::string((string *)local_68,(string *)psVar15,0,0xffffffffffffffff);
          std::vector<cmsys::String,_std::allocator<cmsys::String>_>::emplace_back<cmsys::String>
                    (&(pIVar5->UnusedArguments).
                      super_vector<cmsys::String,_std::allocator<cmsys::String>_>,(String *)local_68
                    );
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          cVar9 = '\0';
        }
        else {
          iVar4 = (*pIVar5->UnknownArgumentCallback)((psVar15->_M_dataplus)._M_p,pIVar5->ClientData)
          ;
          cVar9 = '\x01';
          if (iVar4 == 0) {
            psVar1 = &this->Internals->LastArgument;
            *psVar1 = *psVar1 - 1;
            local_74 = 0;
          }
          else {
            local_74 = 1;
          }
        }
        goto LAB_00447f13;
      }
      if ((long)local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0) {
        lVar13 = 0;
      }
      else {
        lVar6 = (long)local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        psVar10 = &(local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
        uVar11 = 0;
        lVar13 = 0;
        lVar12 = 0;
        do {
          if (uVar11 < *psVar10) {
            uVar11 = *psVar10;
            lVar13 = lVar12;
          }
          lVar12 = lVar12 + 1;
          psVar10 = psVar10 + 4;
        } while (lVar6 + (ulong)(lVar6 == 0) != lVar12);
      }
      pIVar5 = this->Internals;
      std::__cxx11::string::string
                ((string *)local_68,
                 (string *)
                 (local_48.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar13),0,0xffffffffffffffff);
      cs = std::
           map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
           ::operator[](&(pIVar5->Callbacks).
                         super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                        ,(key_type *)local_68);
      if (local_68[0] != local_58) {
        operator_delete(local_68[0],local_58[0] + 1);
      }
      pbVar14 = local_48.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + lVar13;
      iVar4 = std::__cxx11::string::compare((char *)pbVar14);
      if (iVar4 != 0) {
        abort();
      }
      switch(cs->ArgumentType) {
      case 0:
        bVar3 = PopulateVariable(this,cs,(char *)0x0);
        break;
      case 1:
        bVar3 = PopulateVariable(this,cs,(psVar15->_M_dataplus)._M_p + pbVar14->_M_string_length);
        break;
      case 2:
        pIVar5 = this->Internals;
        lVar19 = (long)(pIVar5->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                       super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (sVar18 == ((long)(pIVar5->Argv).
                             super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                             super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                             _M_impl.super__Vector_impl_data._M_finish - lVar19 >> 5) - 1U) {
          pIVar5->LastArgument = pIVar5->LastArgument - 1;
          local_74 = 0;
          cVar9 = '\x01';
          goto LAB_00447f13;
        }
        bVar3 = PopulateVariable(this,cs,*(char **)(lVar19 + (sVar18 + 1) * 0x20));
        uVar11 = sVar18 + 1;
        if (!bVar3) goto LAB_00447eb2;
        goto LAB_00447efa;
      case 3:
        uVar11 = pbVar14->_M_string_length;
        if (psVar15->_M_string_length != uVar11) {
          if (psVar15->_M_string_length <= uVar11) {
            uVar8 = std::__throw_out_of_range_fmt
                              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)"
                              );
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_48);
            _Unwind_Resume(uVar8);
          }
          pcVar2 = (psVar15->_M_dataplus)._M_p;
          if (pcVar2[uVar11] == '=') {
            bVar3 = PopulateVariable(this,cs,pcVar2 + uVar11 + 1);
            break;
          }
        }
        goto LAB_00447eaa;
      case 4:
        do {
          sVar17 = sVar18;
          sVar18 = sVar17 + 1;
          lVar19 = lVar19 + 0x20;
          lVar13 = (long)(this->Internals->Argv).
                         super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                         super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                         super__Vector_impl_data._M_start;
          if ((ulong)((long)(this->Internals->Argv).
                            super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                            super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                            _M_impl.super__Vector_impl_data._M_finish - lVar13 >> 5) <= sVar18)
          goto LAB_00447ee6;
          psVar15 = (string *)(lVar13 + lVar19);
          bVar3 = GetMatchedArguments(this,&local_48,psVar15);
          cVar9 = '\t';
          if (!bVar3) {
            bVar3 = PopulateVariable(this,cs,(psVar15->_M_dataplus)._M_p);
            cVar9 = !bVar3;
            if (!bVar3) {
              local_74 = 0;
            }
          }
        } while (cVar9 == '\0');
        if (cVar9 != '\t') goto LAB_00447f13;
LAB_00447ee6:
        uVar11 = sVar18;
        if ((long)(this->Internals->Argv).
                  super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                  super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->Internals->Argv).
                  super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                  super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                  super__Vector_impl_data._M_start >> 5 == sVar18) goto LAB_00447efa;
        goto LAB_00447efc;
      default:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Got unknown argument type: \"",0x1c);
        poVar7 = (ostream *)std::ostream::operator<<(&std::cerr,cs->ArgumentType);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
LAB_00447eaa:
        psVar1 = &this->Internals->LastArgument;
        *psVar1 = *psVar1 - 1;
LAB_00447eb2:
        local_74 = 0;
        cVar9 = '\x01';
        goto LAB_00447f13;
      }
      uVar11 = sVar18;
      if (bVar3 == false) {
        local_74 = 0;
        cVar9 = '\x01';
      }
      else {
LAB_00447efa:
        sVar17 = uVar11;
LAB_00447efc:
        cVar9 = '\0';
        sVar18 = sVar17;
      }
LAB_00447f13:
      iVar4 = local_74;
      if (cVar9 != '\0') goto LAB_00447f41;
      sVar18 = sVar18 + 1;
      pIVar5 = this->Internals;
      pSVar16 = (pIVar5->Argv).super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (sVar18 < (ulong)((long)(pIVar5->Argv).
                                    super_vector<cmsys::String,_std::allocator<cmsys::String>_>.
                                    super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar16 >> 5)
            );
    iVar4 = 1;
  }
LAB_00447f41:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return iVar4;
}

Assistant:

int CommandLineArguments::Parse()
{
  std::vector<std::string>::size_type cc;
  std::vector<std::string> matches;
  if ( this->StoreUnusedArgumentsFlag )
    {
    this->Internals->UnusedArguments.clear();
    }
  for ( cc = 0; cc < this->Internals->Argv.size(); cc ++ )
    {
    const std::string& arg = this->Internals->Argv[cc];
    CommandLineArguments_DEBUG("Process argument: " << arg);
    this->Internals->LastArgument = cc;
    if ( this->GetMatchedArguments(&matches, arg) )
      {
      // Ok, we found one or more arguments that match what user specified.
      // Let's find the longest one.
      CommandLineArguments::Internal::VectorOfStrings::size_type kk;
      CommandLineArguments::Internal::VectorOfStrings::size_type maxidx = 0;
      CommandLineArguments::Internal::String::size_type maxlen = 0;
      for ( kk = 0; kk < matches.size(); kk ++ )
        {
        if ( matches[kk].size() > maxlen )
          {
          maxlen = matches[kk].size();
          maxidx = kk;
          }
        }
      // So, the longest one is probably the right one. Now see if it has any
      // additional value
      CommandLineArgumentsCallbackStructure *cs 
        = &this->Internals->Callbacks[matches[maxidx]];
      const std::string& sarg = matches[maxidx];
      if ( cs->Argument != sarg )
        {
        abort();
        }
      switch ( cs->ArgumentType )
        {
      case NO_ARGUMENT:
        // No value
        if ( !this->PopulateVariable(cs, 0) )
          {
          return 0;
          }
        break;
      case SPACE_ARGUMENT:
        if ( cc == this->Internals->Argv.size()-1 )
          {
          this->Internals->LastArgument --;
          return 0;
          }
        CommandLineArguments_DEBUG("This is a space argument: " << arg
          << " value: " << this->Internals->Argv[cc+1]);
        // Value is the next argument
        if ( !this->PopulateVariable(cs, this->Internals->Argv[cc+1].c_str()) )
          {
          return 0;
          }
        cc ++;
        break;
      case EQUAL_ARGUMENT:
        if ( arg.size() == sarg.size() || arg.at(sarg.size()) != '=' )
          {
          this->Internals->LastArgument --;
          return 0;
          }
        // Value is everythng followed the '=' sign
        if ( !this->PopulateVariable(cs, arg.c_str() + sarg.size() + 1) )
          {
          return 0;
          }
        break;
      case CONCAT_ARGUMENT:
        // Value is whatever follows the argument
        if ( !this->PopulateVariable(cs, arg.c_str() + sarg.size()) )
          {
          return 0;
          }
        break;
      case MULTI_ARGUMENT:
        // Suck in all the rest of the arguments
        CommandLineArguments_DEBUG("This is a multi argument: " << arg);
        for (cc++; cc < this->Internals->Argv.size(); ++ cc )
          {
          const std::string& marg = this->Internals->Argv[cc];
          CommandLineArguments_DEBUG(" check multi argument value: " << marg);
          if ( this->GetMatchedArguments(&matches, marg) )
            {
            CommandLineArguments_DEBUG("End of multi argument " << arg << " with value: " << marg);
            break;
            }
          CommandLineArguments_DEBUG(" populate multi argument value: " << marg);
          if ( !this->PopulateVariable(cs, marg.c_str()) )
            {
            return 0;
            }
          }
        if ( cc != this->Internals->Argv.size() )
          {
          CommandLineArguments_DEBUG("Again End of multi argument " << arg);
          cc--;
          continue;
          }
        break;
      default:
        std::cerr << "Got unknown argument type: \"" << cs->ArgumentType << "\"" << std::endl;
        this->Internals->LastArgument --;
        return 0;
        }
      }
    else
      {
      // Handle unknown arguments
      if ( this->Internals->UnknownArgumentCallback )
        {
        if ( !this->Internals->UnknownArgumentCallback(arg.c_str(), 
            this->Internals->ClientData) )
          {
          this->Internals->LastArgument --;
          return 0;
          }
        return 1;
        }
      else if ( this->StoreUnusedArgumentsFlag )
        {
        CommandLineArguments_DEBUG("Store unused argument " << arg);
        this->Internals->UnusedArguments.push_back(arg);
        }
      else
        {
        std::cerr << "Got unknown argument: \"" << arg << "\"" << std::endl;
        this->Internals->LastArgument --;
        return 0;
        }
      }
    }
  return 1;
}